

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cc
# Opt level: O1

MoveList * search::movegen::generateAll(MoveList *__return_storage_ptr__,Board *pos,bool onlyCaps)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  long lVar6;
  iterator iVar7;
  int i_1;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  int i;
  Move local_98;
  vector<board::Move,std::allocator<board::Move>> *local_90;
  int (*local_88) [10];
  undefined4 local_7c;
  Board *local_78;
  ulong local_70;
  ulong local_68;
  int (*local_60) [10];
  ulong local_58;
  int (*local_50) [120];
  int (*local_48) [120];
  long local_40;
  int (*local_38) [10];
  
  local_7c = (undefined4)CONCAT71(in_register_00000011,onlyCaps);
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 7;
  if (pos->side == 0) {
    lVar6 = 1;
  }
  local_90 = (vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__;
  local_78 = pos;
  if (0 < pos->pNum[lVar6]) {
    lVar11 = 0;
    uVar2 = -(uint)(pos->side != 0) | 1;
    local_50 = (int (*) [120])(pos->pList + lVar6);
    local_58 = (ulong)(uVar2 * 10);
    local_60 = (int (*) [10])(ulong)(uVar2 * 0x14);
    local_48 = pos->searchHistory;
    local_68 = (ulong)(uVar2 * 9);
    local_70 = (ulong)(uVar2 * 0xb);
    local_40 = lVar6;
    do {
      uVar2 = (*local_50)[lVar11];
      local_88 = (int (*) [10])(ulong)uVar2;
      if (((char)local_7c == '\0') && (iVar8 = uVar2 + (int)local_58, pos->board[iVar8] == 0)) {
        iVar3 = pos->side;
        uVar9 = iVar8 * 0x80;
        local_38 = (int (*) [10])
                   CONCAT44(local_38._4_4_,board::Board::RANKS[board::Board::SQ64[(int)uVar2]]);
        if (board::Board::RANKS[board::Board::SQ64[(int)uVar2]] ==
            *(int *)((long)&PAWN_RANK + (long)iVar3 * 4)) {
          uVar9 = uVar9 | uVar2;
          lVar6 = 0;
          do {
            local_98.value =
                 *(int *)(PROMOTION_PIECES + (long)iVar3 * 0x10 + lVar6 * 4) << 0x14 | uVar9;
            local_98.score =
                 *(int *)(MVVLVA_SCORES +
                         (long)local_78->board[uVar2 & 0x7f] * 4 +
                         (ulong)((uVar9 & 0x3c000) >> 0xe) * 0x34) + 1000000;
            iVar7._M_current = *(Move **)(local_90 + 8);
            if (iVar7._M_current == *(Move **)(local_90 + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
            }
            else {
              *iVar7._M_current = local_98;
              *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
        }
        else {
          local_98.value = uVar9 | uVar2;
          local_98.score =
               *(int *)(MVVLVA_SCORES +
                       (long)pos->board[uVar2 & 0x7f] * 4 +
                       (ulong)(local_98.value >> 0xe & 0xf) * 0x34) + 1000000;
          iVar7._M_current = *(Move **)(local_90 + 8);
          if (iVar7._M_current == *(Move **)(local_90 + 0x10)) {
            std::vector<board::Move,std::allocator<board::Move>>::
            _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
          }
          else {
            *iVar7._M_current = local_98;
            *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
          }
        }
        lVar6 = local_40;
        pos = local_78;
        if ((int)local_38 == *(int *)((long)&PAWN_RANK + ((long)local_78->side ^ 1U) * 4)) {
          iVar8 = (int)local_60 + (uint)local_88;
          if (local_78->board[iVar8] == 0) {
            uVar2 = iVar8 * 0x80 | uVar2;
            uVar9 = uVar2 | 0x80000;
            uVar5 = 0xdbba000000000;
            if ((local_78->searchKillers[0][local_78->ply] != uVar9) &&
               (uVar5 = 0xc350000000000, local_78->searchKillers[1][local_78->ply] != uVar9)) {
              uVar5 = (ulong)*(uint *)((long)local_48[local_78->board[(uint)local_88 & 0x7f]] +
                                      (ulong)(uVar2 >> 5 & 0x1fc)) << 0x20;
            }
            local_98 = (Move)(uVar9 | uVar5);
            iVar7._M_current = *(Move **)(local_90 + 8);
            if (iVar7._M_current == *(Move **)(local_90 + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
            }
            else {
              *iVar7._M_current = local_98;
              *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
            }
          }
        }
      }
      uVar2 = (uint)local_88;
      iVar8 = uVar2 + (int)local_68;
      if (board::Board::SQ64[iVar8] != 99) {
        if ((board::Board::PIECE_COLOR[pos->board[iVar8]] ^ pos->side) == 1) {
          addPawnMove(uVar2,iVar8,pos->board[iVar8],pos->side,(MoveList *)local_90,pos);
        }
      }
      iVar3 = (int)local_70 + uVar2;
      if (board::Board::SQ64[iVar3] != 99) {
        if ((board::Board::PIECE_COLOR[pos->board[iVar3]] ^ pos->side) == 1) {
          addPawnMove(uVar2,iVar3,pos->board[iVar3],pos->side,(MoveList *)local_90,pos);
        }
      }
      if (pos->enPas != 99) {
        if (iVar8 == pos->enPas) {
          local_98 = (Move)(CONCAT44(MVVLVA_SCORES._56_4_ + 1000000,iVar8 * 0x80 | uVar2) | 0x40000)
          ;
          iVar7._M_current = *(Move **)(local_90 + 8);
          if (iVar7._M_current == *(Move **)(local_90 + 0x10)) {
            std::vector<board::Move,std::allocator<board::Move>>::
            _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
          }
          else {
            *iVar7._M_current = local_98;
            *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
          }
        }
        if (iVar3 == pos->enPas) {
          local_98 = (Move)(CONCAT44(MVVLVA_SCORES._56_4_ + 1000000,iVar3 * 0x80 | uVar2) | 0x40000)
          ;
          iVar7._M_current = *(Move **)(local_90 + 8);
          if (iVar7._M_current == *(Move **)(local_90 + 0x10)) {
            std::vector<board::Move,std::allocator<board::Move>>::
            _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
          }
          else {
            *iVar7._M_current = local_98;
            *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pos->pNum[lVar6]);
  }
  local_48 = (int (*) [120])((ulong)(pos->side != 0) * 3);
  local_60 = pos->pList;
  local_50 = pos->searchHistory;
  lVar6 = 0;
  do {
    local_58 = (ulong)*(int *)(SLIDERS + ((long)local_48 + lVar6) * 4);
    local_40 = lVar6;
    if (0 < pos->pNum[local_58]) {
      local_38 = local_60 + local_58;
      local_68 = local_58 << 5;
      local_70 = 0;
      do {
        uVar2 = (*local_38)[local_70];
        local_88 = (int (*) [10])(ulong)(uVar2 & 0x7f);
        lVar6 = 0;
        do {
          iVar8 = *(int *)((long)board::Board::MOVE_DIR[0] + lVar6 * 4 + local_68);
          lVar11 = (long)iVar8;
          if (lVar11 == 0) break;
          uVar9 = (uVar2 + iVar8) * 0x80;
          piVar12 = pos->board + (int)uVar2 + lVar11;
          while( true ) {
            pos = local_78;
            iVar3 = *piVar12;
            if ((long)iVar3 != 0) break;
            if ((char)local_7c == '\0') {
              uVar4 = uVar9 | uVar2;
              uVar5 = 0xdbba000000000;
              if ((local_78->searchKillers[0][local_78->ply] != uVar4) &&
                 (uVar5 = 0xc350000000000, local_78->searchKillers[1][local_78->ply] != uVar4)) {
                uVar5 = (ulong)*(uint *)((long)local_50[local_78->board[(long)local_88]] +
                                        (ulong)(uVar4 >> 5 & 0x1fc)) << 0x20;
              }
              local_98 = (Move)(uVar4 | uVar5);
              iVar7._M_current = *(Move **)(local_90 + 8);
              if (iVar7._M_current == *(Move **)(local_90 + 0x10)) {
                std::vector<board::Move,std::allocator<board::Move>>::
                _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
              }
              else {
                *iVar7._M_current = local_98;
                *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
              }
            }
            uVar9 = uVar9 + iVar8 * 0x80;
            piVar12 = piVar12 + lVar11;
          }
          if ((iVar3 != 99) && ((local_78->side ^ board::Board::PIECE_COLOR[iVar3]) == 1)) {
            local_98.value = uVar9 | uVar2 | iVar3 << 0xe;
            local_98.score =
                 *(int *)(MVVLVA_SCORES +
                         (long)local_78->board[(long)local_88] * 4 +
                         (ulong)(local_98.value >> 0xe & 0xf) * 0x34) + 1000000;
            iVar7._M_current = *(Move **)(local_90 + 8);
            if (iVar7._M_current == *(Move **)(local_90 + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
            }
            else {
              *iVar7._M_current = local_98;
              *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        local_70 = local_70 + 1;
      } while ((long)local_70 < (long)pos->pNum[local_58]);
    }
    lVar6 = local_40 + 1;
  } while (lVar6 != 3);
  local_70 = (ulong)((uint)(pos->side != 0) * 2);
  uVar5 = 0;
  do {
    lVar6 = (long)*(int *)(NON_SLIDERS + (uVar5 | local_70) * 4);
    local_78 = (Board *)lVar6;
    local_68 = uVar5;
    if (0 < pos->pNum[lVar6]) {
      local_88 = local_60 + lVar6;
      lVar11 = 0;
      do {
        uVar2 = (*local_88)[lVar11];
        lVar10 = 0;
        do {
          if (board::Board::MOVE_DIR[lVar6][lVar10] == 0) break;
          iVar3 = board::Board::MOVE_DIR[lVar6][lVar10] + uVar2;
          iVar8 = pos->board[iVar3];
          if ((long)iVar8 == 0) {
            if ((char)local_7c == '\0') {
              uVar9 = iVar3 * 0x80 | uVar2;
              uVar5 = 0xdbba000000000;
              if ((pos->searchKillers[0][pos->ply] != uVar9) &&
                 (uVar5 = 0xc350000000000, pos->searchKillers[1][pos->ply] != uVar9)) {
                uVar5 = (ulong)*(uint *)((long)local_50[pos->board[uVar2 & 0x7f]] +
                                        (ulong)(uVar9 >> 5 & 0x1fc)) << 0x20;
              }
              local_98 = (Move)(uVar9 | uVar5);
              iVar7._M_current = *(Move **)(local_90 + 8);
              if (iVar7._M_current != *(Move **)(local_90 + 0x10)) goto LAB_001302ec;
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
            }
          }
          else if ((iVar8 != 99) && ((pos->side ^ board::Board::PIECE_COLOR[iVar8]) == 1)) {
            local_98.value = iVar3 * 0x80 | uVar2 | iVar8 << 0xe;
            local_98.score =
                 *(int *)(MVVLVA_SCORES +
                         (long)pos->board[uVar2 & 0x7f] * 4 +
                         (ulong)(local_98.value >> 0xe & 0xf) * 0x34) + 1000000;
            iVar7._M_current = *(Move **)(local_90 + 8);
            if (iVar7._M_current == *(Move **)(local_90 + 0x10)) {
              std::vector<board::Move,std::allocator<board::Move>>::
              _M_realloc_insert<board::Move_const&>(local_90,iVar7,&local_98);
            }
            else {
LAB_001302ec:
              *iVar7._M_current = local_98;
              *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        lVar11 = lVar11 + 1;
      } while (lVar11 < pos->pNum[(long)local_78]);
    }
    uVar5 = local_68 + 1;
    if (local_68 != 0) {
      if ((char)local_7c == '\0') {
        if (pos->side == 0) {
          if (((((pos->castlePerm & 1U) != 0) && (pos->board[0x1a] == 0)) && (pos->board[0x1b] == 0)
              ) && ((bVar1 = board::Board::sqAttacked(pos,0x19,1), !bVar1 &&
                    (bVar1 = board::Board::sqAttacked(pos,0x1a,1), !bVar1)))) {
            addQuietMove(0x1000d99,(MoveList *)local_90,pos);
          }
          if ((pos->castlePerm & 2) == 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x18] != 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x17] != 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x16] != 0) {
            return (MoveList *)local_90;
          }
          bVar1 = board::Board::sqAttacked(pos,0x19,1);
          if (bVar1) {
            return (MoveList *)local_90;
          }
          bVar1 = board::Board::sqAttacked(pos,0x18,1);
          iVar8 = 0x1000b99;
        }
        else {
          if ((((pos->castlePerm & 4U) != 0) && (pos->board[0x60] == 0)) &&
             ((pos->board[0x61] == 0 &&
              ((bVar1 = board::Board::sqAttacked(pos,0x5f,0), !bVar1 &&
               (bVar1 = board::Board::sqAttacked(pos,0x60,0), !bVar1)))))) {
            addQuietMove(0x10030df,(MoveList *)local_90,pos);
          }
          if ((pos->castlePerm & 8) == 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x5e] != 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x5d] != 0) {
            return (MoveList *)local_90;
          }
          if (pos->board[0x5c] != 0) {
            return (MoveList *)local_90;
          }
          bVar1 = board::Board::sqAttacked(pos,0x5f,0);
          if (bVar1) {
            return (MoveList *)local_90;
          }
          bVar1 = board::Board::sqAttacked(pos,0x5e,0);
          iVar8 = 0x1002edf;
        }
        if (bVar1 == false) {
          addQuietMove(iVar8,(MoveList *)local_90,pos);
        }
      }
      return (MoveList *)local_90;
    }
  } while( true );
}

Assistant:

search::MoveList search::movegen::generateAll(board::Board& pos, const bool onlyCaps)
{
    MoveList moves;
    int square;
    int piece;
    int offset;
    int direction;
    int targetSquare;
    pos.getSide() == board::WHITE ? piece = board::WP : piece = board::BP;
    pos.getSide() == board::WHITE ? offset = 1 : offset = -1;
    for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
        square = pos.getPieceList(piece)[pceNum];
        if (!onlyCaps) {
            if (pos.getSquare(square + offset * 10) == board::EMPTY) {
                addPawnMove(square, square + offset * 10, board::EMPTY, pos.getSide(), moves, pos);
                if (board::Board::RANKS[board::Board::SQ64[square]] == PAWN_RANK[(pos.getSide() ^ 1)] &&
                    pos.getSquare(square + offset * 20) == board::EMPTY) {
                    addQuietMove(board::Move::MOVE(square, square + offset * 20, board::EMPTY, board::EMPTY,
                                                   board::Move::MFLAGPS),
                                 moves, pos);
                }
            }
        }
        if (board::Board::SQ64[square + offset * 9] != board::NO_SQ &&
            board::Board::PIECE_COLOR[pos.getSquare(square + offset * 9)] == (pos.getSide() ^ 1)) {
            addPawnMove(square, square + offset * 9, pos.getSquare(square + offset * 9), pos.getSide(), moves, pos);
        }
        if (board::Board::SQ64[square + offset * 11] != board::NO_SQ &&
            board::Board::PIECE_COLOR[pos.getSquare(square + offset * 11)] == (pos.getSide() ^ 1)) {
            addPawnMove(square, square + offset * 11, pos.getSquare(square + offset * 11), pos.getSide(), moves, pos);
        }
        if (pos.getEnPas() != board::NO_SQ) {
            if (square + offset * 9 == pos.getEnPas()) {
                addEnPasMove(
                    board::Move::MOVE(square, square + offset * 9, board::EMPTY, board::EMPTY, board::Move::MFLAGEP),
                    moves);
            }
            if (square + offset * 11 == pos.getEnPas()) {
                addEnPasMove(
                    board::Move::MOVE(square, square + offset * 11, board::EMPTY, board::EMPTY, board::Move::MFLAGEP),
                    moves);
            }
        }
    }
    pos.getSide() == board::WHITE ? offset = 0 : offset = 3;
    for (int index = 0; index < 3; index++) {
        piece = SLIDERS[index + offset];
        for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
            square = pos.getPieceList(piece)[pceNum];
            for (int i = 0; i < 8 && board::Board::MOVE_DIR[piece][i] != 0; i++) {
                direction = board::Board::MOVE_DIR[piece][i];
                targetSquare = square + direction;
                while (pos.getSquare(targetSquare) != board::NO_SQ) {
                    if (pos.getSquare(targetSquare) != board::EMPTY) {
                        if (board::Board::PIECE_COLOR[pos.getSquare(targetSquare)] == (pos.getSide() ^ 1)) {
                            addCaptureMove(
                                board::Move::MOVE(square, targetSquare, pos.getSquare(targetSquare), board::EMPTY, 0),
                                moves, pos);
                        }
                        break;
                    }
                    if (!onlyCaps) {
                        addQuietMove(board::Move::MOVE(square, targetSquare, board::EMPTY, board::EMPTY, 0), moves,
                                     pos);
                    }
                    targetSquare += direction;
                }
            }
        }
    }
    pos.getSide() == board::WHITE ? offset = 0 : offset = 2;
    for (int index = 0; index < 2; index++) {
        piece = NON_SLIDERS[index + offset];
        for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
            square = pos.getPieceList(piece)[pceNum];
            for (int i = 0; i < 8 && board::Board::MOVE_DIR[piece][i] != 0; i++) {
                direction = board::Board::MOVE_DIR[piece][i];
                targetSquare = square + direction;
                if (pos.getSquare(targetSquare) == board::NO_SQ) {
                    continue;
                }
                if (pos.getSquare(targetSquare) != board::EMPTY) {
                    if (board::Board::PIECE_COLOR[pos.getSquare(targetSquare)] == (pos.getSide() ^ 1)) {
                        addCaptureMove(
                            board::Move::MOVE(square, targetSquare, pos.getSquare(targetSquare), board::EMPTY, 0),
                            moves, pos);
                    }
                    continue;
                }
                if (!onlyCaps) {
                    addQuietMove(board::Move::MOVE(square, targetSquare, board::EMPTY, board::EMPTY, 0), moves, pos);
                }
            }
        }
    }
    if (!onlyCaps) {
        if (pos.getSide() == board::WHITE) {
            if (pos.getCastlePerm() & board::WKCA) {
                if (pos.getSquare(board::F1) == board::EMPTY && pos.getSquare(board::G1) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E1, board::BLACK) && !pos.sqAttacked(board::F1, board::BLACK)) {
                        addQuietMove(
                            board::Move::MOVE(board::E1, board::G1, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
            if (pos.getCastlePerm() & board::WQCA) {
                if (pos.getSquare(board::D1) == board::EMPTY && pos.getSquare(board::C1) == board::EMPTY &&
                    pos.getSquare(board::B1) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E1, board::BLACK) && !pos.sqAttacked(board::D1, board::BLACK)) {
                        addQuietMove(
                            board::Move::MOVE(board::E1, board::C1, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
        }
        else {
            if (pos.getCastlePerm() & board::BKCA) {
                if (pos.getSquare(board::F8) == board::EMPTY && pos.getSquare(board::G8) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E8, board::WHITE) && !pos.sqAttacked(board::F8, board::WHITE)) {
                        addQuietMove(
                            board::Move::MOVE(board::E8, board::G8, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
            if (pos.getCastlePerm() & board::BQCA) {
                if (pos.getSquare(board::D8) == board::EMPTY && pos.getSquare(board::C8) == board::EMPTY &&
                    pos.getSquare(board::B8) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E8, board::WHITE) && !pos.sqAttacked(board::D8, board::WHITE)) {
                        addQuietMove(
                            board::Move::MOVE(board::E8, board::C8, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
        }
    }
    return moves;
}